

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

bool vkt::shaderexecutor::ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::
     doContains(IVal *ival,Vector<float,_2> *value)

{
  bool bVar1;
  Interval *ival_00;
  float *value_00;
  int local_24;
  int ndx;
  Vector<float,_2> *value_local;
  IVal *ival_local;
  
  local_24 = 0;
  while( true ) {
    if (1 < local_24) {
      return true;
    }
    ival_00 = tcu::Vector<tcu::Interval,_2>::operator[](ival,local_24);
    value_00 = tcu::Vector<float,_2>::operator[](value,local_24);
    bVar1 = contains<float>(ival_00,value_00);
    if (!bVar1) break;
    local_24 = local_24 + 1;
  }
  return false;
}

Assistant:

static bool			doContains		(const IVal& ival, const T& value)
	{
		for (int ndx = 0; ndx < T::SIZE; ++ndx)
			if (!contains(ival[ndx], value[ndx]))
				return false;

		return true;
	}